

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_buffer.cpp
# Opt level: O0

void __thiscall
duckdb::CSVBuffer::CSVBuffer
          (CSVBuffer *this,CSVFileHandle *file_handle,ClientContext *context,idx_t buffer_size,
          idx_t global_csv_current_position,idx_t buffer_idx_p)

{
  bool bVar1;
  CSVFileHandle *this_00;
  idx_t nr_bytes;
  idx_t iVar2;
  ulong in_RCX;
  undefined8 in_RDX;
  CSVFileHandle *in_RSI;
  undefined1 *in_RDI;
  CSVBuffer *this_01;
  undefined8 in_R8;
  undefined8 in_R9;
  data_ptr_t buffer;
  byte local_81;
  BufferHandle *in_stack_ffffffffffffff80;
  CSVFileHandle *buffer_00;
  idx_t in_stack_ffffffffffffff98;
  
  *in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = in_RDX;
  *(ulong *)(in_RDI + 0x18) = in_RCX;
  *(undefined8 *)(in_RDI + 0x20) = in_R8;
  bVar1 = CSVFileHandle::CanSeek(in_RSI);
  in_RDI[0x28] = bVar1;
  bVar1 = CSVFileHandle::IsPipe(in_RSI);
  in_RDI[0x29] = bVar1;
  *(undefined8 *)(in_RDI + 0x30) = in_R9;
  this_01 = (CSVBuffer *)(in_RDI + 0x38);
  shared_ptr<duckdb::BlockHandle,_true>::shared_ptr
            ((shared_ptr<duckdb::BlockHandle,_true> *)0x1762b5f);
  BufferHandle::BufferHandle(in_stack_ffffffffffffff80);
  AllocateBuffer(this_01,in_stack_ffffffffffffff98);
  BufferHandle::Ptr((BufferHandle *)0x1762b93);
  buffer_00 = in_RSI;
  this_00 = (CSVFileHandle *)BufferHandle::Ptr((BufferHandle *)0x1762bbf);
  nr_bytes = CSVFileHandle::Read(this_00,buffer_00,(idx_t)in_stack_ffffffffffffff80);
  *(idx_t *)(in_RDI + 0x10) = nr_bytes;
  while( true ) {
    local_81 = 0;
    if (*(ulong *)(in_RDI + 0x10) < in_RCX) {
      bVar1 = CSVFileHandle::FinishedReading(in_RSI);
      local_81 = bVar1 ^ 0xff;
    }
    if ((local_81 & 1) == 0) break;
    iVar2 = CSVFileHandle::Read(this_00,buffer_00,nr_bytes);
    *(idx_t *)(in_RDI + 0x10) = iVar2 + *(long *)(in_RDI + 0x10);
  }
  bVar1 = CSVFileHandle::FinishedReading(in_RSI);
  *in_RDI = bVar1;
  return;
}

Assistant:

CSVBuffer::CSVBuffer(CSVFileHandle &file_handle, ClientContext &context, idx_t buffer_size,
                     idx_t global_csv_current_position, idx_t buffer_idx_p)
    : context(context), requested_size(buffer_size), global_csv_start(global_csv_current_position),
      can_seek(file_handle.CanSeek()), is_pipe(file_handle.IsPipe()), buffer_idx(buffer_idx_p) {
	AllocateBuffer(buffer_size);
	auto buffer = handle.Ptr();
	actual_buffer_size = file_handle.Read(handle.Ptr(), buffer_size);
	while (actual_buffer_size < buffer_size && !file_handle.FinishedReading()) {
		// We keep reading until this block is full
		actual_buffer_size += file_handle.Read(&buffer[actual_buffer_size], buffer_size - actual_buffer_size);
	}
	last_buffer = file_handle.FinishedReading();
}